

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::ConstPool::add(ConstPool *this,void *data,size_t size,size_t *dstOffset)

{
  ZoneTree<asmjit::v1_14::ConstPool::Node> *this_00;
  size_t sVar1;
  Gap *pGVar2;
  Zone *pZVar3;
  Error EVar4;
  uint uVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  Node *pNVar9;
  ulong uVar10;
  ulong uVar11;
  size_t offset;
  void *__s2;
  bool bVar12;
  long local_80;
  undefined8 local_58;
  undefined1 *local_50;
  ulong local_48;
  size_t local_40;
  ulong local_38;
  
  EVar4 = 2;
  if (0xf < (long)size) {
    if (size == 0x10) {
      lVar6 = 4;
    }
    else {
      if (size == 0x40) {
        lVar6 = 6;
        bVar12 = true;
        goto LAB_0011b063;
      }
      if (size != 0x20) {
        return 2;
      }
      lVar6 = 5;
    }
    goto LAB_0011b060;
  }
  switch(size) {
  case 1:
    bVar12 = false;
    lVar6 = 0;
    goto LAB_0011b063;
  case 2:
    lVar6 = 1;
    break;
  default:
    goto switchD_0011b01c_caseD_3;
  case 4:
    lVar6 = 2;
    break;
  case 8:
    lVar6 = 3;
  }
LAB_0011b060:
  bVar12 = false;
LAB_0011b063:
  uVar11 = *(ulong *)(&this->field_0x8 + lVar6 * 0x18);
  if (uVar11 == 0) {
LAB_0011b0bd:
    if (bVar12) {
LAB_0011b136:
      offset = this->_size;
      sVar7 = (-size & (offset - 1) + size) - offset;
      if (sVar7 != 0) {
        ConstPool_addGap(this,offset,sVar7);
        offset = sVar7 + this->_size;
      }
      this->_size = offset + size;
    }
    else {
      lVar8 = lVar6 + -6;
      offset = 0xffffffffffffffff;
      do {
        pGVar2 = this->_gaps[lVar6];
        if (pGVar2 != (Gap *)0x0) {
          offset = pGVar2->_offset;
          sVar7 = pGVar2->_size;
          this->_gaps[lVar6] = pGVar2->_next;
          pGVar2->_next = this->_gapPool;
          this->_gapPool = pGVar2;
          if (offset % size != 0) goto LAB_0011b3d6;
          sVar7 = sVar7 - size;
          if (sVar7 != 0) {
            ConstPool_addGap(this,offset,sVar7);
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0);
      if (offset == 0xffffffffffffffff) goto LAB_0011b136;
    }
    pZVar3 = this->_zone;
    uVar11 = size + 0x1f & 0xfffffffffffffff8;
    pNVar9 = (Node *)(*(long *)pZVar3 + 7U & 0xfffffffffffffff8);
    if (pNVar9 < *(Node **)(pZVar3 + 8) &&
        uVar11 <= (ulong)((long)*(Node **)(pZVar3 + 8) - (long)pNVar9)) {
      *(Node **)pZVar3 = pNVar9 + uVar11;
    }
    else {
      pNVar9 = (Node *)Zone::_alloc(pZVar3,uVar11,8);
    }
    if (pNVar9 == (Node *)0x0) {
      return 1;
    }
    *(undefined8 *)pNVar9 = 0;
    *(undefined8 *)(pNVar9 + 8) = 0;
    pNVar9[0x10] = (Node)((byte)pNVar9[0x10] & 0xfe);
    *(int *)(pNVar9 + 0x14) = (int)offset;
    memcpy(pNVar9 + 0x18,data,size);
    local_58 = *(undefined8 *)(&this->field_0x18 + lVar6 * 0x18);
    ZoneTree<asmjit::v1_14::ConstPool::Node>::insert<asmjit::v1_14::ConstPool::Compare>
              ((ZoneTree<asmjit::v1_14::ConstPool::Node> *)(&this->field_0x8 + lVar6 * 0x18),pNVar9,
               (Compare *)&local_58);
    *(long *)(&this->field_0x10 + lVar6 * 0x18) = *(long *)(&this->field_0x10 + lVar6 * 0x18) + 1;
    uVar11 = this->_alignment;
    if (this->_alignment <= size) {
      uVar11 = size;
    }
    this->_alignment = uVar11;
    *dstOffset = offset;
    if (4 < size) {
      local_50 = &this->field_0x8;
      local_80 = 1;
      sVar7 = size;
      local_40 = offset;
      do {
        bVar12 = lVar6 == 0;
        lVar6 = lVar6 + -1;
        if (bVar12) {
          add();
LAB_0011b3d6:
          add();
          return 1;
        }
        local_80 = local_80 * 2;
        uVar11 = sVar7 >> 1;
        local_48 = sVar7;
        if (local_80 != 0) {
          this_00 = (ZoneTree<asmjit::v1_14::ConstPool::Node> *)(local_50 + lVar6 * 0x18);
          local_38 = uVar11 + 0x1f & 0xfffffffffffffff8;
          lVar8 = 0;
          __s2 = data;
          do {
            uVar10 = *(ulong *)this_00;
            if (uVar10 == 0) {
LAB_0011b2d7:
              pZVar3 = this->_zone;
              pNVar9 = (Node *)(*(long *)pZVar3 + 7U & 0xfffffffffffffff8);
              if (pNVar9 < *(Node **)(pZVar3 + 8) &&
                  local_38 <= (ulong)((long)*(Node **)(pZVar3 + 8) - (long)pNVar9)) {
                *(Node **)pZVar3 = pNVar9 + local_38;
              }
              else {
                pNVar9 = (Node *)Zone::_alloc(pZVar3,local_38,8);
              }
              if (pNVar9 != (Node *)0x0) {
                *(undefined8 *)pNVar9 = 0;
                *(undefined8 *)(pNVar9 + 8) = 0;
                pNVar9[0x10] = (Node)((byte)pNVar9[0x10] | 1);
                *(int *)(pNVar9 + 0x14) = (int)lVar8 * (int)uVar11 + (int)local_40;
                memcpy(pNVar9 + 0x18,__s2,uVar11);
              }
              local_58 = *(undefined8 *)(this_00 + 0x10);
              ZoneTree<asmjit::v1_14::ConstPool::Node>::insert<asmjit::v1_14::ConstPool::Compare>
                        (this_00,pNVar9,(Compare *)&local_58);
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 1;
            }
            else {
              sVar1 = *(size_t *)(this_00 + 0x10);
              do {
                uVar5 = memcmp((void *)(uVar10 + 0x18),__s2,sVar1);
                if (uVar5 == 0) break;
                uVar10 = *(ulong *)(uVar10 + (ulong)(uVar5 >> 0x1f) * 8) & 0xfffffffffffffffe;
              } while (uVar10 != 0);
              if (uVar10 == 0) goto LAB_0011b2d7;
            }
            lVar8 = lVar8 + 1;
            __s2 = (void *)((long)__s2 + uVar11);
          } while (lVar8 != local_80);
        }
        sVar7 = uVar11;
      } while (9 < local_48);
    }
    uVar11 = this->_minItemSize;
    uVar10 = size;
    if (uVar11 < size) {
      uVar10 = uVar11;
    }
    if (uVar11 == 0) {
      uVar10 = size;
    }
    this->_minItemSize = uVar10;
  }
  else {
    sVar1 = *(size_t *)(&this->field_0x18 + lVar6 * 0x18);
    do {
      uVar5 = memcmp((void *)(uVar11 + 0x18),data,sVar1);
      if (uVar5 == 0) break;
      uVar11 = *(ulong *)(uVar11 + (ulong)(uVar5 >> 0x1f) * 8) & 0xfffffffffffffffe;
    } while (uVar11 != 0);
    if (uVar11 == 0) goto LAB_0011b0bd;
    *dstOffset = (ulong)*(uint *)(uVar11 + 0x14);
  }
  EVar4 = 0;
switchD_0011b01c_caseD_3:
  return EVar4;
}

Assistant:

Error ConstPool::add(const void* data, size_t size, size_t& dstOffset) noexcept {
  size_t treeIndex;

  if (size == 64)
    treeIndex = kIndex64;
  else if (size == 32)
    treeIndex = kIndex32;
  else if (size == 16)
    treeIndex = kIndex16;
  else if (size == 8)
    treeIndex = kIndex8;
  else if (size == 4)
    treeIndex = kIndex4;
  else if (size == 2)
    treeIndex = kIndex2;
  else if (size == 1)
    treeIndex = kIndex1;
  else
    return DebugUtils::errored(kErrorInvalidArgument);

  ConstPool::Node* node = _tree[treeIndex].get(data);
  if (node) {
    dstOffset = node->_offset;
    return kErrorOk;
  }

  // Before incrementing the current offset try if there is a gap that can be used for the requested data.
  size_t offset = ~size_t(0);
  size_t gapIndex = treeIndex;

  while (gapIndex != kIndexCount - 1) {
    ConstPool::Gap* gap = _gaps[treeIndex];

    // Check if there is a gap.
    if (gap) {
      size_t gapOffset = gap->_offset;
      size_t gapSize = gap->_size;

      // Destroy the gap for now.
      _gaps[treeIndex] = gap->_next;
      ConstPool_freeGap(this, gap);

      offset = gapOffset;
      ASMJIT_ASSERT(Support::isAligned<size_t>(offset, size));

      gapSize -= size;
      if (gapSize > 0)
        ConstPool_addGap(this, gapOffset, gapSize);
    }

    gapIndex++;
  }

  if (offset == ~size_t(0)) {
    // Get how many bytes have to be skipped so the address is aligned accordingly to the 'size'.
    size_t diff = Support::alignUpDiff<size_t>(_size, size);

    if (diff != 0) {
      ConstPool_addGap(this, _size, diff);
      _size += diff;
    }

    offset = _size;
    _size += size;
  }

  // Add the initial node to the right index.
  node = ConstPool::Tree::_newNode(_zone, data, size, offset, false);
  if (ASMJIT_UNLIKELY(!node))
    return DebugUtils::errored(kErrorOutOfMemory);

  _tree[treeIndex].insert(node);
  _alignment = Support::max<size_t>(_alignment, size);

  dstOffset = offset;

  // Now create a bunch of shared constants that are based on the data pattern. We stop at size 4,
  // it probably doesn't make sense to split constants down to 1 byte.
  size_t pCount = 1;
  size_t smallerSize = size;

  while (smallerSize > 4) {
    pCount <<= 1;
    smallerSize >>= 1;

    ASMJIT_ASSERT(treeIndex != 0);
    treeIndex--;

    const uint8_t* pData = static_cast<const uint8_t*>(data);
    for (size_t i = 0; i < pCount; i++, pData += smallerSize) {
      node = _tree[treeIndex].get(pData);
      if (node) continue;

      node = ConstPool::Tree::_newNode(_zone, pData, smallerSize, offset + (i * smallerSize), true);
      _tree[treeIndex].insert(node);
    }
  }

  if (_minItemSize == 0)
    _minItemSize = size;
  else
    _minItemSize = Support::min(_minItemSize, size);

  return kErrorOk;
}